

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O0

UBool __thiscall
icu_63::number::impl::SymbolsWrapper::copyErrorTo(SymbolsWrapper *this,UErrorCode *status)

{
  UErrorCode *status_local;
  SymbolsWrapper *this_local;
  
  if ((this->fType == SYMPTR_DFS) && ((this->fPtr).dfs == (DecimalFormatSymbols *)0x0)) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    this_local._7_1_ = '\x01';
  }
  else if ((this->fType == SYMPTR_NS) && ((this->fPtr).dfs == (DecimalFormatSymbols *)0x0)) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool copyErrorTo(UErrorCode &status) const {
        if (fType == SYMPTR_DFS && fPtr.dfs == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return TRUE;
        } else if (fType == SYMPTR_NS && fPtr.ns == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return TRUE;
        }
        return FALSE;
    }